

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

SatInfo miniscript::internal::operator+(SatInfo *a,SatInfo *b)

{
  long lVar1;
  byte *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  SatInfo SVar2;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int *in_stack_ffffffffffffffb0;
  undefined8 local_14;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*in_RDI & 1) == 0) || ((*in_RSI & 1) == 0)) {
    SatInfo::SatInfo((SatInfo *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    std::max<int>(in_stack_ffffffffffffffb0,
                  (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    SatInfo::SatInfo((SatInfo *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,
                     0x7f38f9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    SVar2.exec = local_c;
    SVar2._0_8_ = local_14;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

SatInfo operator+(const SatInfo& a, const SatInfo& b) noexcept
    {
        // Concatenation with an empty set yields an empty set.
        if (!a.valid || !b.valid) return {};
        // Otherwise, the maximum stack size difference for the combined scripts is the sum of the
        // netdiffs, and the maximum stack size difference anywhere is either b.exec (if the
        // maximum occurred in b) or b.netdiff+a.exec (if the maximum occurred in a).
        return {a.netdiff + b.netdiff, std::max(b.exec, b.netdiff + a.exec)};
    }